

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall
MarkdownHighlighter::highlightAdditionalRules
          (MarkdownHighlighter *this,QVector<HighlightingRule> *rules,QString *text)

{
  QString *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_iterator o;
  HighlightingRule *pHVar4;
  QTextCharFormat *pQVar5;
  ulong uVar6;
  qreal qVar7;
  pair<int,_int> local_b8;
  pair<int,_int> local_b0;
  int local_a8;
  int local_a4;
  int end;
  int start;
  QTextCharFormat currentMaskedFormat;
  QRegularExpressionMatch match;
  QTextCharFormat *format;
  QRegularExpressionMatchIterator local_68 [2];
  uint8_t maskedGroup;
  uint8_t capturingGroup;
  QRegularExpressionMatchIterator iterator;
  bool contains;
  HighlightingRule *rule;
  const_iterator __end1;
  const_iterator __begin1;
  QVector<HighlightingRule> *__range1;
  QTextCharFormat *local_28;
  QTextCharFormat *maskedFormat;
  QString *text_local;
  QVector<HighlightingRule> *rules_local;
  MarkdownHighlighter *this_local;
  
  __range1._4_4_ = 0x18;
  maskedFormat = (QTextCharFormat *)text;
  text_local = (QString *)rules;
  rules_local = (QVector<HighlightingRule> *)this;
  local_28 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                       (&_formats,(HighlighterState *)((long)&__range1 + 4));
  QList<std::pair<int,_int>_>::clear(&this->_linkRanges);
  this_00 = text_local;
  __end1 = QList<MarkdownHighlighter::HighlightingRule>::begin
                     ((QList<MarkdownHighlighter::HighlightingRule> *)text_local);
  o = QList<MarkdownHighlighter::HighlightingRule>::end
                ((QList<MarkdownHighlighter::HighlightingRule> *)this_00);
  while (bVar1 = QList<MarkdownHighlighter::HighlightingRule>::const_iterator::operator!=(&__end1,o)
        , bVar1) {
    pHVar4 = QList<MarkdownHighlighter::HighlightingRule>::const_iterator::operator*(&__end1);
    iVar3 = QSyntaxHighlighter::currentBlockState();
    if ((iVar3 == -1) &&
       (bVar1 = QString::contains((QString *)maskedFormat,&pHVar4->shouldContain,CaseSensitive),
       pQVar5 = maskedFormat, bVar1)) {
      QFlags<QRegularExpression::MatchOption>::QFlags
                ((QFlags<QRegularExpression::MatchOption> *)((long)&format + 4),NoMatchOption);
      QRegularExpression::globalMatch
                ((QString *)local_68,(longlong)pHVar4,(MatchType)pQVar5,(QFlags_conflict1 *)0x0);
      format._3_1_ = pHVar4->capturingGroup;
      format._2_1_ = pHVar4->maskedGroup;
      pQVar5 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                         (&_formats,&pHVar4->state);
      while (bVar2 = QRegularExpressionMatchIterator::hasNext(), (bVar2 & 1) != 0) {
        QRegularExpressionMatchIterator::next();
        if (format._3_1_ != 0) {
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)&end,local_28);
          qVar7 = QTextCharFormat::fontPointSize(pQVar5);
          if (0.0 < qVar7) {
            qVar7 = QTextCharFormat::fontPointSize(pQVar5);
            QTextCharFormat::setFontPointSize((QTextCharFormat *)&end,qVar7);
          }
          iVar3 = QSyntaxHighlighter::currentBlockState();
          if ((iVar3 < 0xc) || (iVar3 = QSyntaxHighlighter::currentBlockState(), 0x11 < iVar3)) {
            if (pHVar4->state == Link) {
              local_a4 = QRegularExpressionMatch::capturedStart((int)&currentMaskedFormat + 8);
              iVar3 = QRegularExpressionMatch::capturedStart((int)&currentMaskedFormat + 8);
              local_a8 = QRegularExpressionMatch::capturedLength((int)&currentMaskedFormat + 8);
              local_a8 = iVar3 + local_a8;
              std::pair<int,_int>::pair<int,_int,_true>(&local_b0,&local_a4,&local_a8);
              bVar1 = QListSpecialMethodsBase<std::pair<int,int>>::contains<std::pair<int,int>>
                                ((QListSpecialMethodsBase<std::pair<int,int>> *)&this->_linkRanges,
                                 &local_b0);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                std::pair<int,_int>::pair<int,_int,_true>(&local_b8,&local_a4,&local_a8);
                QList<std::pair<int,_int>_>::append(&this->_linkRanges,&local_b8);
              }
            }
            iVar3 = QRegularExpressionMatch::capturedStart((int)&currentMaskedFormat + 8);
            uVar6 = QRegularExpressionMatch::capturedLength((int)&currentMaskedFormat + 8);
            QSyntaxHighlighter::setFormat((int)this,iVar3,(QTextCharFormat *)(uVar6 & 0xffffffff));
          }
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)&end);
        }
        iVar3 = QSyntaxHighlighter::currentBlockState();
        if ((iVar3 < 0xc) || (iVar3 = QSyntaxHighlighter::currentBlockState(), 0x11 < iVar3)) {
          iVar3 = QRegularExpressionMatch::capturedStart((int)&currentMaskedFormat + 8);
          uVar6 = QRegularExpressionMatch::capturedLength((int)&currentMaskedFormat + 8);
          QSyntaxHighlighter::setFormat((int)this,iVar3,(QTextCharFormat *)(uVar6 & 0xffffffff));
        }
        else {
          setHeadingStyles(this,pHVar4->state,
                           (QRegularExpressionMatch *)&currentMaskedFormat.field_0x8,
                           (uint)format._3_1_);
        }
        QRegularExpressionMatch::~QRegularExpressionMatch
                  ((QRegularExpressionMatch *)&currentMaskedFormat.field_0x8);
      }
      QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_68);
    }
    QList<MarkdownHighlighter::HighlightingRule>::const_iterator::operator++(&__end1);
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightAdditionalRules(
    const QVector<HighlightingRule> &rules, const QString &text) {
    const auto &maskedFormat = _formats[HighlighterState::MaskedSyntax];
    _linkRanges.clear();

    for (const HighlightingRule &rule : rules) {
        // continue if another current block state was already set if
        // disableIfCurrentStateIsSet is set
        if (currentBlockState() != NoState) continue;

        const bool contains = text.contains(rule.shouldContain);
        if (!contains) continue;

        auto iterator = rule.pattern.globalMatch(text);
        const uint8_t capturingGroup = rule.capturingGroup;
        const uint8_t maskedGroup = rule.maskedGroup;
        const QTextCharFormat &format = _formats[rule.state];

        // find and format all occurrences
        while (iterator.hasNext()) {
            QRegularExpressionMatch match = iterator.next();

            // if there is a capturingGroup set then first highlight
            // everything as MaskedSyntax and highlight capturingGroup
            // with the real format
            if (capturingGroup > 0) {
                QTextCharFormat currentMaskedFormat = maskedFormat;
                // set the font size from the current rule's font format
                if (format.fontPointSize() > 0) {
                    currentMaskedFormat.setFontPointSize(
                        format.fontPointSize());
                }

                if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                    // setHeadingStyles(format, match, maskedGroup);

                } else {
                    // store masked part of the link as a range
                    if (rule.state == Link) {
                        const int start = match.capturedStart(maskedGroup);
                        const int end = match.capturedStart(maskedGroup) +
                                        match.capturedLength(maskedGroup);
                        if (!_linkRanges.contains({start, end})) {
                            _linkRanges.append({start, end});
                        }
                    }

                    setFormat(match.capturedStart(maskedGroup),
                              match.capturedLength(maskedGroup),
                              currentMaskedFormat);
                }
            }
            if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                setHeadingStyles(rule.state, match, capturingGroup);

            } else {
                setFormat(match.capturedStart(capturingGroup),
                          match.capturedLength(capturingGroup), format);
            }
        }
    }
}